

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  Mat *in_RDI;
  int i;
  Mat *in_stack_ffffffffffffffa8;
  Mat local_48;
  int local_c;
  
  for (local_c = 0; local_c < 0x14; local_c = local_c + 1) {
    *(undefined4 *)((long)in_RDI + (long)local_c * 0x40 + 0x10) = 0;
    Mat::Mat(&local_48);
    Mat::operator=(in_stack_ffffffffffffffa8,in_RDI);
    Mat::~Mat((Mat *)0x15ed1e);
  }
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        params[i].loaded = 0;
        params[i].v = Mat();
    }
}